

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9InputFormat(_func_int_jx9_context_ptr_char_ptr_int_void_ptr *xConsumer,jx9_context *pCtx,
                    char *zIn,int nByte,int nArg,jx9_value **apArg,void *pUserData,int vf)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  ushort uVar5;
  int iVar6;
  sxi32 sVar7;
  uint uVar8;
  undefined8 uVar9;
  byte bVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  jx9_value **ppjVar14;
  byte *pbVar15;
  char *pcVar16;
  byte bVar17;
  undefined4 uVar18;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  char cVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  byte *pbVar26;
  uint uVar27;
  char *pcVar28;
  uint uVar29;
  bool bVar30;
  bool bVar31;
  ushort in_FPUControlWord;
  byte *pbStack_510;
  int length;
  uint local_504;
  int local_500;
  uint local_4fc;
  undefined8 local_4f0;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  ushort local_4d8;
  ushort local_4d6;
  ushort local_4d4;
  ushort local_4d2;
  ulong local_4d0;
  _func_int_jx9_context_ptr_char_ptr_int_void_ptr *local_4c8;
  jx9_context *local_4c0;
  jx9_value **local_4b8;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  int local_4a0;
  int local_49c;
  int local_498;
  int local_494;
  ulong local_490;
  double local_488;
  double local_480;
  char spaces [51];
  char zWorker [1024];
  
  builtin_strncpy(spaces,"                                                  ",0x33);
  pcVar28 = zIn + nByte;
  local_504 = (uint)(vf != 1);
  pbStack_510 = (byte *)(ulong)(uint)-vf;
  local_490 = (ulong)-(uint)(vf != 0);
  local_4e4 = nArg;
  local_4c8 = xConsumer;
  local_4c0 = pCtx;
  local_4b8 = apArg;
  do {
    for (lVar19 = 0; pcVar20 = zIn + lVar19, pcVar20 < pcVar28; lVar19 = lVar19 + 1) {
      if (*pcVar20 == '%') {
        if (pcVar20 <= zIn) goto LAB_0012f4d2;
        goto LAB_0012f4aa;
      }
    }
    if (pcVar20 <= zIn) {
      return (sxi32)pbStack_510;
    }
LAB_0012f4aa:
    iVar6 = (*local_4c8)(local_4c0,zIn,(int)lVar19,pUserData);
    if (pcVar28 <= pcVar20) {
      return iVar6;
    }
    if (iVar6 == -10) {
      return -10;
    }
LAB_0012f4d2:
    local_500 = 0;
    iVar6 = 0;
    uVar18 = 0;
    iVar25 = 0;
    iVar24 = 0;
    pcVar20 = zIn + lVar19 + 1;
    do {
      cVar22 = *pcVar20;
      switch(cVar22) {
      case '\'':
        pcVar20 = pcVar20 + 1;
        if (pcVar28 <= pcVar20) goto switchD_0012f503_caseD_28;
        cVar22 = *pcVar20;
        for (lVar19 = 0; lVar19 != 0x32; lVar19 = lVar19 + 1) {
          spaces[lVar19] = cVar22;
        }
        break;
      case '(':
      case ')':
      case '*':
      case ',':
      case '.':
      case '/':
switchD_0012f503_caseD_28:
        pcVar16 = pcVar20;
        goto LAB_0012f558;
      case '+':
        uVar18 = 1;
        break;
      case '-':
        local_500 = 1;
        break;
      case '0':
        iVar25 = 1;
        break;
      default:
        if (cVar22 != '\0') {
          if (cVar22 == ' ') {
            iVar6 = 1;
          }
          else {
            if (cVar22 != '#') goto switchD_0012f503_caseD_28;
            iVar24 = 1;
          }
        }
      }
      pcVar16 = pcVar20 + 1;
      bVar30 = pcVar20 < pcVar28;
      pcVar20 = pcVar16;
    } while (bVar30);
LAB_0012f558:
    uVar27 = 0;
    while (pcVar12 = pcVar16 + 1, pcVar20 = pcVar16, pcVar16 < pcVar28) {
      bVar4 = *pcVar16 - 0x30;
      if (9 < bVar4) {
        if (*pcVar16 == '$') {
          if (0 < (int)uVar27) {
            local_504 = (int)local_490 + uVar27;
          }
          pcVar20 = pcVar12;
          if ((pcVar12 < pcVar28) && (*pcVar12 == '0')) {
            iVar25 = 1;
            pcVar20 = pcVar16 + 2;
          }
          uVar27 = 0;
          for (; (pcVar20 < pcVar28 && ((byte)(*pcVar20 - 0x30U) < 10)); pcVar20 = pcVar20 + 1) {
            uVar27 = (uint)(byte)(*pcVar20 - 0x30U) + uVar27 * 10;
          }
        }
        break;
      }
      uVar27 = (uint)bVar4 + uVar27 * 10;
      pcVar16 = pcVar12;
    }
    uVar9 = 0x3f6;
    sVar7 = 0x3f6;
    local_4fc = 0x3f6;
    if ((int)uVar27 < 0x3f6) {
      local_4fc = uVar27;
    }
    if ((pcVar20 < pcVar28) && (*pcVar20 == '.')) {
      uVar29 = 0;
      while( true ) {
        sVar7 = (sxi32)uVar9;
        pcVar20 = pcVar20 + 1;
        if (pcVar28 <= pcVar20) break;
        bVar4 = *pcVar20 - 0x30;
        uVar9 = CONCAT71((int7)((ulong)uVar9 >> 8),bVar4);
        sVar7 = (sxi32)uVar9;
        if (9 < bVar4) break;
        uVar29 = (uint)bVar4 + uVar29 * 10;
      }
    }
    else {
      uVar29 = 0xffffffff;
    }
    if (pcVar28 <= pcVar20) {
      return sVar7;
    }
    local_4f0 = CONCAT44(local_4f0._4_4_,uVar18);
    zIn = pcVar20 + 1;
    lVar19 = -0x1f;
    do {
      lVar13 = lVar19;
      if (lVar13 + 0x20 == 0x1e1) goto switchD_0012f682_caseD_5;
      lVar19 = lVar13 + 0x20;
    } while (*pcVar20 != *(char *)((long)&aFmt[0].prefix + lVar13 + 7));
    length = 0;
    bVar4 = *(byte *)((long)&aFmt[1].flags + lVar13 + 3);
    uVar21 = (ulong)bVar4;
    uVar8 = bVar4 - 1;
    if (uVar8 < 8) {
      lVar19 = (long)(int)local_504;
      switch((uint)bVar4) {
      case 1:
        ppjVar14 = (jx9_value **)
                   ((long)&switchD_0012f682::switchdataD_00139960 +
                   (long)(int)(&switchD_0012f682::switchdataD_00139960)[uVar8]);
        uVar27 = local_504;
        if ((int)local_504 < local_4e4) {
          uVar27 = local_504 + 1;
          ppjVar14 = local_4b8;
          if (local_4b8[lVar19] == (jx9_value *)0x0) goto LAB_0012f97f;
          local_504 = iVar24;
          local_4e0 = iVar6;
          local_4dc = iVar25;
          pbVar15 = (byte *)jx9_value_to_int64(local_4b8[lVar19]);
          if (0x3d7 < (int)uVar29) {
            uVar29 = 0x3d8;
          }
          ppjVar14 = (jx9_value **)CONCAT71(3,pbVar15 == (byte *)0x0);
          bVar30 = local_504 == 0 || pbVar15 == (byte *)0x0;
          iVar6 = local_4e0;
          iVar25 = local_4dc;
        }
        else {
LAB_0012f97f:
          if (0x3d7 < (int)uVar29) {
            uVar29 = 0x3d8;
          }
          bVar30 = true;
          pbVar15 = (byte *)0x0;
        }
        local_4d0 = CONCAT71(local_4d0._1_7_,bVar30);
        if (((&aFmt[1].field_0x3)[lVar13] & 1) == 0) {
          pbVar26 = (byte *)-(long)pbVar15;
          if ((long)pbVar15 < 1) {
            pbVar15 = pbVar26;
          }
          local_4f0 = CONCAT44(local_4f0._4_4_,(int)CONCAT71((int7)((ulong)pbVar26 >> 8),1));
          iVar6 = 0;
          bVar4 = 0;
        }
        else {
          if ((long)pbVar15 < 0) {
            pbVar15 = (byte *)-(long)pbVar15;
            bVar4 = 0x2d;
          }
          else {
            if ((int)local_4f0 == 0) {
              local_4f0 = CONCAT44(local_4f0._4_4_,
                                   (int)CONCAT71((int7)((ulong)ppjVar14 >> 8),iVar6 == 0));
              bVar1 = iVar6 != 0;
              iVar6 = -(uint)bVar1;
              bVar4 = bVar1 << 5;
              goto LAB_0012ff29;
            }
            bVar4 = 0x2b;
          }
          local_4f0 = (ulong)local_4f0._4_4_ << 0x20;
          iVar6 = -1;
        }
LAB_0012ff29:
        uVar8 = iVar6 + local_4fc;
        if ((int)(iVar6 + local_4fc) < (int)uVar29) {
          uVar8 = uVar29;
        }
        lVar19 = *(long *)(&aFmt[1].field_0xf + lVar13);
        bVar10 = (&aFmt[1].fmttype)[lVar13];
        iVar6 = 0;
        pcVar16 = zWorker + 0x3ff;
        pbVar26 = (byte *)(zWorker + 0x3fd);
        do {
          pcVar20 = (char *)pbVar26;
          pbStack_510 = (byte *)((long)pbVar15 / (long)(ulong)bVar10);
          bVar17 = *(byte *)(lVar19 + (long)pbVar15 % (long)(ulong)bVar10);
          pcVar16[-1] = bVar17;
          pcVar16 = pcVar16 + -1;
          iVar6 = iVar6 + 1;
          pbVar15 = pbStack_510;
          pbVar26 = (byte *)pcVar20 + -1;
        } while (0 < (long)pbStack_510);
        if (iVar25 == 0) {
          uVar8 = uVar29;
        }
        for (iVar6 = uVar8 - iVar6; 0 < iVar6; iVar6 = iVar6 + -1) {
          *pcVar20 = 0x30;
          pcVar20 = (char *)((byte *)pcVar20 + -1);
          bVar17 = 0x30;
        }
        if ((char)local_4f0 == '\0') {
          *pcVar20 = bVar4;
        }
        else {
          pcVar20 = (char *)((byte *)pcVar20 + 1);
          bVar4 = bVar17;
        }
        if (((bVar30 == false) &&
            (pbStack_510 = *(byte **)((long)&aFmt[1].charset + lVar13 + 7),
            pbStack_510 != (byte *)0x0)) && (bVar10 = *pbStack_510, bVar4 != bVar10)) {
          while (pbStack_510 = pbStack_510 + 1, bVar10 != 0) {
            ((byte *)pcVar20)[-1] = bVar10;
            pcVar20 = (char *)((byte *)pcVar20 + -1);
            bVar10 = *pbStack_510;
          }
        }
        length = ((int)zWorker + 0x3ff) - (int)pcVar20;
        local_504 = uVar27;
        break;
      default:
        dVar2 = 0.0;
        local_4d0 = uVar21;
        if ((int)local_504 < local_4e4) {
          local_504 = local_504 + 1;
          dVar2 = 0.0;
          if (local_4b8[lVar19] != (jx9_value *)0x0) {
            local_4e0 = iVar6;
            local_4dc = iVar25;
            dVar2 = jx9_value_to_double(local_4b8[lVar19]);
            local_480 = dVar2;
            iVar25 = local_4dc;
            iVar6 = local_4e0;
          }
          bVar4 = (byte)local_4d0;
        }
        uVar8 = 0x3d8;
        if ((int)uVar29 < 0x3d8) {
          uVar8 = uVar29;
        }
        if ((int)uVar29 < 0) {
          uVar8 = 6;
        }
        if (0.0 <= dVar2) {
          if ((int)local_4f0 == 0) {
            bVar30 = iVar6 == 0;
            uVar21 = (ulong)!bVar30;
            cVar22 = !bVar30 << 5;
          }
          else {
            cVar22 = '+';
            bVar30 = false;
            uVar21 = 1;
          }
        }
        else {
          dVar2 = -dVar2;
          cVar22 = '-';
          bVar30 = false;
          uVar21 = 1;
        }
        pcVar20 = zWorker;
        uVar8 = uVar8 - (0 < (int)uVar8 && bVar4 == 4);
        pbStack_510 = (byte *)(ulong)uVar8;
        local_488 = 0.5;
        for (uVar29 = uVar8; 0 < (int)uVar29; uVar29 = uVar29 - 1) {
          local_488 = local_488 * 0.1;
        }
        if (bVar4 == 2) {
          dVar2 = dVar2 + local_488;
        }
        uVar29 = 0;
        if (0.0 < dVar2) {
          uVar11 = 0xfffffea1;
          for (uVar29 = 0; (100000000.0 <= dVar2 && (uVar29 < 0x15f)); uVar29 = uVar29 + 8) {
            dVar2 = dVar2 * 1e-08;
            uVar11 = uVar11 + 8;
          }
          for (; (10.0 <= dVar2 && (uVar29 < 0x15f)); uVar29 = uVar29 + 1) {
            dVar2 = dVar2 * 0.1;
            uVar11 = uVar11 + 1;
          }
          for (; (dVar2 < 1e-08 && (-0x15f < (int)uVar29)); uVar29 = uVar29 - 8) {
            dVar2 = dVar2 * 100000000.0;
            uVar11 = uVar11 - 8;
          }
          for (; (uVar29 = uVar11 + 0x15f, dVar2 < 1.0 && (-0x15f < (int)uVar29));
              uVar11 = uVar11 - 1) {
            dVar2 = dVar2 * 10.0;
          }
          if (uVar11 < 0xfffffd43) {
            length = 3;
            pbStack_510 = (byte *)0x3;
            pcVar20 = "NaN";
            break;
          }
        }
        if (bVar4 == 2) {
          bVar1 = true;
          bVar31 = false;
LAB_0012fb50:
          if ((!bVar1) || (iVar6 = (int)pbStack_510, 0x3e1 < (int)(iVar6 + uVar29)))
          goto LAB_0012fc02;
          pbVar26 = (byte *)pcVar20;
          if (!bVar30) {
            zWorker[0] = cVar22;
            pbVar26 = (byte *)(zWorker + 1);
          }
          if ((int)uVar29 < 0) {
            *pbVar26 = 0x30;
            pbVar26 = pbVar26 + 1;
            iVar23 = uVar29 + 1;
            uVar8 = 0;
          }
          else {
            uVar8 = uVar29 + 1;
            for (lVar19 = 0; uVar29 + 1 != (uint)lVar19; lVar19 = lVar19 + 1) {
              bVar4 = 0x30;
              if ((uint)lVar19 < 0x10) {
                local_4d2 = in_FPUControlWord | 0xc00;
                local_4a8 = (int)ROUND(dVar2);
                dVar2 = (dVar2 - (double)local_4a8) * 10.0;
                bVar4 = (char)local_4a8 + 0x30;
                local_4a4 = local_4a8;
              }
              pbVar26[lVar19] = bVar4;
            }
            pbVar26 = pbVar26 + lVar19;
            iVar23 = 0;
          }
          if (0 < iVar6 || iVar24 != 0) {
            *pbVar26 = 0x2e;
            pbVar26 = pbVar26 + 1;
          }
          pbVar15 = pbVar26 + -1;
          for (; (iVar23 < 0 && (0 < (int)pbStack_510));
              pbStack_510 = (byte *)(ulong)((int)pbStack_510 - 1)) {
            *pbVar26 = 0x30;
            pbVar26 = pbVar26 + 1;
            iVar23 = iVar23 + 1;
            pbVar15 = pbVar15 + 1;
          }
          for (; 0 < (int)pbStack_510; pbStack_510 = (byte *)(ulong)((int)pbStack_510 - 1)) {
            bVar4 = 0x30;
            if (uVar8 < 0x10) {
              local_4d4 = in_FPUControlWord | 0xc00;
              local_4b0 = (int)ROUND(dVar2);
              dVar2 = (dVar2 - (double)local_4b0) * 10.0;
              bVar4 = (char)local_4b0 + 0x30;
              local_4ac = local_4b0;
            }
            pbVar15[1] = bVar4;
            pbVar15 = pbVar15 + 1;
            uVar8 = uVar8 + 1;
          }
          pbVar15[1] = 0;
          if ((bool)(bVar31 & (0 < iVar6 || iVar24 != 0))) {
            for (; pcVar20 <= pbVar15; pbVar15 = pbVar15 + -1) {
              bVar4 = *pbVar15;
              pbStack_510 = (byte *)(ulong)bVar4;
              if (bVar4 != 0x30) {
                if (bVar4 == 0x2e) {
                  *pbVar15 = 0;
                  pbVar15 = pbVar15 + -1;
                }
                break;
              }
              *pbVar15 = 0;
            }
          }
LAB_0012fe69:
          iVar6 = (int)pbVar15 + 1;
        }
        else {
          dVar3 = local_488 + dVar2;
          dVar2 = dVar3;
          if (dVar3 >= 10.0) {
            dVar2 = dVar3 * 0.1;
          }
          uVar29 = (uVar29 + 1) - (uint)(dVar3 < 10.0);
          if (bVar4 == 4) {
            bVar31 = iVar24 == 0;
            bVar1 = (int)uVar29 <= (int)uVar8 && -5 < (int)uVar29;
            uVar11 = 0;
            if ((int)uVar29 <= (int)uVar8 && -5 < (int)uVar29) {
              uVar11 = uVar29;
            }
            pbStack_510 = (byte *)(ulong)(uVar8 - uVar11);
            goto LAB_0012fb50;
          }
          bVar31 = false;
LAB_0012fc02:
          bVar1 = 0 < (int)pbStack_510;
          pbVar15 = (byte *)pcVar20;
          if (!bVar30) {
            zWorker[0] = cVar22;
            pbVar15 = (byte *)(zWorker + 1);
          }
          local_4d6 = in_FPUControlWord | 0xc00;
          local_498 = (int)ROUND(dVar2);
          dVar2 = (dVar2 - (double)local_498) * 10.0;
          *pbVar15 = (char)local_498 + 0x30;
          if (bVar1 || iVar24 != 0) {
            pbVar15[1] = 0x2e;
            pbVar15 = pbVar15 + 2;
          }
          else {
            pbVar15 = pbVar15 + 1;
          }
          pbVar15 = pbVar15 + -1;
          uVar8 = 1;
          for (; 0 < (int)pbStack_510; pbStack_510 = (byte *)(ulong)((int)pbStack_510 - 1)) {
            bVar4 = 0x30;
            if (uVar8 < 0x10) {
              local_4d8 = in_FPUControlWord | 0xc00;
              local_4a0 = (int)ROUND(dVar2);
              dVar2 = (dVar2 - (double)local_4a0) * 10.0;
              bVar4 = (char)local_4a0 + 0x30;
              local_49c = local_4a0;
            }
            pbVar15[1] = bVar4;
            pbVar15 = pbVar15 + 1;
            uVar8 = uVar8 + 1;
          }
          if ((bool)(bVar31 & (bVar1 || iVar24 != 0))) {
            for (; pcVar20 <= pbVar15; pbVar15 = pbVar15 + -1) {
              bVar4 = *pbVar15;
              pbStack_510 = (byte *)(ulong)bVar4;
              if (bVar4 != 0x30) {
                if (bVar4 == 0x2e) {
                  *pbVar15 = 0;
                  pbVar15 = pbVar15 + -1;
                }
                break;
              }
              *pbVar15 = 0;
            }
          }
          local_494 = local_498;
          if (((char)local_4d0 != '\x03') && (uVar29 == 0)) goto LAB_0012fe69;
          pbVar15[1] = **(byte **)(&aFmt[1].field_0xf + lVar13);
          uVar8 = -uVar29;
          if (0 < (int)uVar29) {
            uVar8 = uVar29;
          }
          uVar5 = (ushort)uVar8;
          pbVar15[2] = (char)((int)uVar29 >> 0x1f) * -2 + 0x2b;
          if (uVar8 < 100) {
            pbVar15 = pbVar15 + 3;
          }
          else {
            uVar5 = (ushort)((ulong)uVar8 % 100);
            pbVar15[3] = (char)((ulong)uVar8 / 100) + 0x30;
            pbVar15 = pbVar15 + 4;
          }
          bVar4 = (byte)((uVar5 & 0xff) % 10);
          pbStack_510 = (byte *)((ulong)CONCAT11(bVar4,(char)((uVar5 & 0xff) / 10)) | 0x30);
          *pbVar15 = (byte)pbStack_510;
          pbVar15[1] = bVar4 | 0x30;
          iVar6 = (int)pbVar15 + 2;
        }
        length = iVar6 - (int)pcVar20;
        local_4f0 = uVar21;
        if ((iVar25 != 0) && (local_500 == 0)) {
          uVar29 = local_4fc - length;
          pbStack_510 = (byte *)(ulong)uVar29;
          if (uVar29 != 0 && length <= (int)local_4fc) {
            if (0x3f5 < (int)uVar27) {
              uVar27 = 0x3f6;
            }
            pcVar16 = zWorker + length;
            for (lVar19 = (long)(int)uVar27; (int)uVar29 <= lVar19; lVar19 = lVar19 + -1) {
              zWorker[lVar19] = *pcVar16;
              pcVar16 = pcVar16 + -1;
            }
            for (lVar19 = 0; uVar29 != (uint)lVar19; lVar19 = lVar19 + 1) {
              zWorker[lVar19 + uVar21] = '0';
            }
            pbStack_510 = (byte *)(ulong)local_4fc;
            length = local_4fc;
          }
        }
        break;
      case 5:
        goto switchD_0012f682_caseD_5;
      case 6:
        uVar27 = local_504;
        if ((int)local_504 < local_4e4) {
          uVar27 = local_504 + 1;
          if ((local_4b8[lVar19] == (jx9_value *)0x0) ||
             (pbStack_510 = (byte *)jx9_value_to_string(local_4b8[lVar19],&length),
             pcVar20 = (char *)pbStack_510, length < 1)) goto LAB_0012ffed;
        }
        else {
LAB_0012ffed:
          length = 1;
          pbStack_510 = (byte *)0x1;
          pcVar20 = (char *)(byte *)0x13eb55;
        }
        if (uVar29 < (uint)length) {
          length = uVar29;
        }
        local_504 = uVar27;
        if (iVar25 != 0) {
          for (pbStack_510 = (byte *)0x0; pbStack_510 != (byte *)0x32; pbStack_510 = pbStack_510 + 1
              ) {
            spaces[(long)pbStack_510] = '0';
          }
        }
        break;
      case 7:
        zWorker[0] = '%';
        goto LAB_0012f72c;
      case 8:
        if ((int)local_504 < local_4e4) {
          local_504 = local_504 + 1;
          if (local_4b8[lVar19] == (jx9_value *)0x0) goto LAB_0012f95a;
          uVar27 = jx9_value_to_int(local_4b8[lVar19]);
          pbStack_510 = (byte *)(ulong)uVar27;
        }
        else {
LAB_0012f95a:
          pbStack_510 = (byte *)0x0;
        }
        pcVar20 = zWorker;
        zWorker[0] = (char)pbStack_510;
        length = 1;
      }
    }
    else {
switchD_0012f682_caseD_5:
      zWorker[0] = '?';
LAB_0012f72c:
      length = 1;
      pbStack_510 = (byte *)0x1;
      pcVar20 = zWorker;
    }
    if ((local_500 == 0) && (uVar27 = local_4fc - length, uVar27 != 0 && length <= (int)local_4fc))
    {
      for (; 0x31 < uVar27; uVar27 = uVar27 - 0x32) {
        uVar29 = (*local_4c8)(local_4c0,spaces,0x32,pUserData);
        pbStack_510 = (byte *)(ulong)uVar29;
        if (uVar29 != 0) {
          return uVar29;
        }
      }
      if (uVar27 != 0) {
        uVar27 = (*local_4c8)(local_4c0,spaces,uVar27,pUserData);
        pbStack_510 = (byte *)(ulong)uVar27;
        if (uVar27 != 0) {
          return uVar27;
        }
      }
    }
    if (0 < length) {
      uVar27 = (*local_4c8)(local_4c0,pcVar20,length,pUserData);
      pbStack_510 = (byte *)(ulong)uVar27;
      if (uVar27 != 0) {
        return uVar27;
      }
    }
    if (local_500 != 0) {
      uVar27 = local_4fc - length;
      pbStack_510 = (byte *)(ulong)uVar27;
      bVar30 = length <= (int)local_4fc;
      local_4fc = uVar27;
      if (uVar27 != 0 && bVar30) {
        for (; 0x31 < uVar27; uVar27 = uVar27 - 0x32) {
          uVar29 = (*local_4c8)(local_4c0,spaces,0x32,pUserData);
          pbStack_510 = (byte *)(ulong)uVar29;
          if (uVar29 != 0) {
            return uVar29;
          }
        }
        if (uVar27 != 0) {
          uVar27 = (*local_4c8)(local_4c0,spaces,uVar27,pUserData);
          pbStack_510 = (byte *)(ulong)uVar27;
          if (uVar27 != 0) {
            return uVar27;
          }
        }
      }
    }
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 jx9InputFormat(
	int (*xConsumer)(jx9_context *, const char *, int, void *), /* Format consumer */
	jx9_context *pCtx,  /* call context */
	const char *zIn,    /* Format string */
	int nByte,          /* Format string length */
	int nArg,           /* Total argument of the given arguments */
	jx9_value **apArg,  /* User arguments */
	void *pUserData,    /* Last argument to xConsumer() */
	int vf              /* TRUE if called from vfprintf, vsprintf context */ 
	)
{
	char spaces[] = "                                                  ";
#define etSPACESIZE ((int)sizeof(spaces)-1)
	const char *zCur, *zEnd = &zIn[nByte];
	char *zBuf, zWorker[JX9_FMT_BUFSIZ];       /* Working buffer */
	const jx9_fmt_info *pInfo;  /* Pointer to the appropriate info structure */
	int flag_alternateform; /* True if "#" flag is present */
	int flag_leftjustify;   /* True if "-" flag is present */
	int flag_blanksign;     /* True if " " flag is present */
	int flag_plussign;      /* True if "+" flag is present */
	int flag_zeropad;       /* True if field width constant starts with zero */
	jx9_value *pArg;         /* Current processed argument */
	jx9_int64 iVal;
	int precision;           /* Precision of the current field */
	char *zExtra;  
	int c, rc, n;
	int length;              /* Length of the field */
	int prefix;
	sxu8 xtype;              /* Conversion paradigm */
	int width;               /* Width of the current field */
	int idx;
	n = (vf == TRUE) ? 0 : 1;
#define NEXT_ARG	( n < nArg ? apArg[n++] : 0 )
	/* Start the format process */
	for(;;){
		zCur = zIn;
		while( zIn < zEnd && zIn[0] != '%' ){
			zIn++;
		}
		if( zCur < zIn ){
			/* Consume chunk verbatim */
			rc = xConsumer(pCtx, zCur, (int)(zIn-zCur), pUserData);
			if( rc == SXERR_ABORT ){
				/* Callback request an operation abort */
				break;
			}
		}
		if( zIn >= zEnd ){
			/* No more input to process, break immediately */
			break;
		}
		/* Find out what flags are present */
		flag_leftjustify = flag_plussign = flag_blanksign = 
			flag_alternateform = flag_zeropad = 0;
		zIn++; /* Jump the precent sign */
		do{
			c = zIn[0];
			switch( c ){
			case '-':   flag_leftjustify = 1;     c = 0;   break;
			case '+':   flag_plussign = 1;        c = 0;   break;
			case ' ':   flag_blanksign = 1;       c = 0;   break;
			case '#':   flag_alternateform = 1;   c = 0;   break;
			case '0':   flag_zeropad = 1;         c = 0;   break;
			case '\'':
				zIn++;
				if( zIn < zEnd ){
					/* An alternate padding character can be specified by prefixing it with a single quote (') */
					c = zIn[0];
					for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
						spaces[idx] = (char)c;
					}
					c = 0;
				}
				break;
			default:                                       break;
			}
		}while( c==0 && (zIn++ < zEnd) );
		/* Get the field width */
		width = 0;
		while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
			width = width*10 + (zIn[0] - '0');
			zIn++;
		}
		if( zIn < zEnd && zIn[0] == '$' ){
			/* Position specifer */
			if( width > 0 ){
				n = width;
				if( vf && n > 0 ){ 
					n--;
				}
			}
			zIn++;
			width = 0;
			if( zIn < zEnd && zIn[0] == '0' ){
				flag_zeropad = 1;
				zIn++;
			}
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				width = width*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( width > JX9_FMT_BUFSIZ-10 ){
			width = JX9_FMT_BUFSIZ-10;
		}
		/* Get the precision */
		precision = -1;
		if( zIn < zEnd && zIn[0] == '.' ){
			precision = 0;
			zIn++;
			while( zIn < zEnd && ( zIn[0] >='0' && zIn[0] <='9') ){
				precision = precision*10 + (zIn[0] - '0');
				zIn++;
			}
		}
		if( zIn >= zEnd ){
			/* No more input */
			break;
		}
		/* Fetch the info entry for the field */
		pInfo = 0;
		xtype = JX9_FMT_ERROR;
		c = zIn[0];
		zIn++; /* Jump the format specifer */
		for(idx=0; idx< (int)SX_ARRAYSIZE(aFmt); idx++){
			if( c==aFmt[idx].fmttype ){
				pInfo = &aFmt[idx];
				xtype = pInfo->type;
				break;
			}
		}
		zBuf = zWorker; /* Point to the working buffer */
		length = 0;
		zExtra = 0;
		 /*
		  ** At this point, variables are initialized as follows:
		  **
		  **   flag_alternateform          TRUE if a '#' is present.
		  **   flag_plussign               TRUE if a '+' is present.
		  **   flag_leftjustify            TRUE if a '-' is present or if the
		  **                               field width was negative.
		  **   flag_zeropad                TRUE if the width began with 0.
		  **                               the conversion character.
		  **   flag_blanksign              TRUE if a ' ' is present.
		  **   width                       The specified field width.  This is
		  **                               always non-negative.  Zero is the default.
		  **   precision                   The specified precision.  The default
		  **                               is -1.
		  */
		switch(xtype){
		case JX9_FMT_PERCENT:
			/* A literal percent character */
			zWorker[0] = '%';
			length = (int)sizeof(char);
			break;
		case JX9_FMT_CHARX:
			/* The argument is treated as an integer, and presented as the character
			 * with that ASCII value
			 */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				c = 0;
			}else{
				c = jx9_value_to_int(pArg);
			}
			/* NUL byte is an acceptable value */
			zWorker[0] = (char)c;
			length = (int)sizeof(char);
			break;
		case JX9_FMT_STRING:
			/* the argument is treated as and presented as a string */
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				length = 0;
			}else{
				zBuf = (char *)jx9_value_to_string(pArg, &length);
			}
			if( length < 1 ){
				zBuf = " ";
				length = (int)sizeof(char);
			}
			if( precision>=0 && precision<length ){
				length = precision;
			}
			if( flag_zeropad ){
				/* zero-padding works on strings too */
				for(idx = 0 ; idx < etSPACESIZE ; ++idx ){
					spaces[idx] = '0';
				}
			}
			break;
		case JX9_FMT_RADIX:
			pArg = NEXT_ARG;
			if( pArg == 0 ){
				iVal = 0;
			}else{
				iVal = jx9_value_to_int64(pArg);
			}
			/* Limit the precision to prevent overflowing buf[] during conversion */
			if( precision>JX9_FMT_BUFSIZ-40 ){
				precision = JX9_FMT_BUFSIZ-40;
			}
#if 1
        /* For the format %#x, the value zero is printed "0" not "0x0".
        ** I think this is stupid.*/
        if( iVal==0 ) flag_alternateform = 0;
#else
        /* More sensible: turn off the prefix for octal (to prevent "00"), 
        ** but leave the prefix for hex.*/
        if( iVal==0 && pInfo->base==8 ) flag_alternateform = 0;
#endif
        if( pInfo->flags & JX9_FMT_FLAG_SIGNED ){
          if( iVal<0 ){ 
            iVal = -iVal;
			/* Ticket 1433-003 */
			if( iVal < 0 ){
				/* Overflow */
				iVal= 0x7FFFFFFFFFFFFFFF;
			}
            prefix = '-';
          }else if( flag_plussign )  prefix = '+';
          else if( flag_blanksign )  prefix = ' ';
          else                       prefix = 0;
        }else{
			if( iVal<0 ){
				iVal = -iVal;
				/* Ticket 1433-003 */
				if( iVal < 0 ){
					/* Overflow */
					iVal= 0x7FFFFFFFFFFFFFFF;
				}
			}
			prefix = 0;
		}
        if( flag_zeropad && precision<width-(prefix!=0) ){
          precision = width-(prefix!=0);
        }
        zBuf = &zWorker[JX9_FMT_BUFSIZ-1];
        {
          register char *cset;      /* Use registers for speed */
          register int base;
          cset = pInfo->charset;
          base = pInfo->base;
          do{                                           /* Convert to ascii */
            *(--zBuf) = cset[iVal%base];
            iVal = iVal/base;
          }while( iVal>0 );
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
        for(idx=precision-length; idx>0; idx--){
          *(--zBuf) = '0';                             /* Zero pad */
        }
        if( prefix ) *(--zBuf) = (char)prefix;               /* Add sign */
        if( flag_alternateform && pInfo->prefix ){      /* Add "0" or "0x" */
          char *pre, x;
          pre = pInfo->prefix;
          if( *zBuf!=pre[0] ){
            for(pre=pInfo->prefix; (x=(*pre))!=0; pre++) *(--zBuf) = x;
          }
        }
        length = (int)(&zWorker[JX9_FMT_BUFSIZ-1]-zBuf);
		break;
		case JX9_FMT_FLOAT:
		case JX9_FMT_EXP:
		case JX9_FMT_GENERIC:{
#ifndef JX9_OMIT_FLOATING_POINT
		long double realvalue;
		int  exp;                /* exponent of real numbers */
		double rounder;          /* Used for rounding floating point values */
		int flag_dp;            /* True if decimal point should be shown */
		int flag_rtz;           /* True if trailing zeros should be removed */
		int flag_exp;           /* True to force display of the exponent */
		int nsd;                 /* Number of significant digits returned */
		pArg = NEXT_ARG;
		if( pArg == 0 ){
			realvalue = 0;
		}else{
			realvalue = jx9_value_to_double(pArg);
		}
        if( precision<0 ) precision = 6;         /* Set default precision */
        if( precision>JX9_FMT_BUFSIZ-40) precision = JX9_FMT_BUFSIZ-40;
        if( realvalue<0.0 ){
          realvalue = -realvalue;
          prefix = '-';
        }else{
          if( flag_plussign )          prefix = '+';
          else if( flag_blanksign )    prefix = ' ';
          else                         prefix = 0;
        }
        if( pInfo->type==JX9_FMT_GENERIC && precision>0 ) precision--;
        rounder = 0.0;
#if 0
        /* Rounding works like BSD when the constant 0.4999 is used.Wierd! */
        for(idx=precision, rounder=0.4999; idx>0; idx--, rounder*=0.1);
#else
        /* It makes more sense to use 0.5 */
        for(idx=precision, rounder=0.5; idx>0; idx--, rounder*=0.1);
#endif
        if( pInfo->type==JX9_FMT_FLOAT ) realvalue += rounder;
        /* Normalize realvalue to within 10.0 > realvalue >= 1.0 */
        exp = 0;
        if( realvalue>0.0 ){
          while( realvalue>=1e8 && exp<=350 ){ realvalue *= 1e-8; exp+=8; }
          while( realvalue>=10.0 && exp<=350 ){ realvalue *= 0.1; exp++; }
          while( realvalue<1e-8 && exp>=-350 ){ realvalue *= 1e8; exp-=8; }
          while( realvalue<1.0 && exp>=-350 ){ realvalue *= 10.0; exp--; }
          if( exp>350 || exp<-350 ){
            zBuf = "NaN";
            length = 3;
            break;
          }
        }
        zBuf = zWorker;
        /*
        ** If the field type is etGENERIC, then convert to either etEXP
        ** or etFLOAT, as appropriate.
        */
        flag_exp = xtype==JX9_FMT_EXP;
        if( xtype!=JX9_FMT_FLOAT ){
          realvalue += rounder;
          if( realvalue>=10.0 ){ realvalue *= 0.1; exp++; }
        }
        if( xtype==JX9_FMT_GENERIC ){
          flag_rtz = !flag_alternateform;
          if( exp<-4 || exp>precision ){
            xtype = JX9_FMT_EXP;
          }else{
            precision = precision - exp;
            xtype = JX9_FMT_FLOAT;
          }
        }else{
          flag_rtz = 0;
        }
        /*
        ** The "exp+precision" test causes output to be of type etEXP if
        ** the precision is too large to fit in buf[].
        */
        nsd = 0;
        if( xtype==JX9_FMT_FLOAT && exp+precision<JX9_FMT_BUFSIZ-30 ){
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;         /* Sign */
          if( exp<0 )  *(zBuf++) = '0';            /* Digits before "." */
          else for(; exp>=0; exp--) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          if( flag_dp ) *(zBuf++) = '.';           /* The decimal point */
          for(exp++; exp<0 && precision>0; precision--, exp++){
            *(zBuf++) = '0';
          }
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          *(zBuf--) = 0;                           /* Null terminate */
          if( flag_rtz && flag_dp ){     /* Remove trailing zeros and "." */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
        }else{    /* etEXP or etGENERIC */
          flag_dp = (precision>0 || flag_alternateform);
          if( prefix ) *(zBuf++) = (char)prefix;   /* Sign */
          *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);  /* First digit */
          if( flag_dp ) *(zBuf++) = '.';     /* Decimal point */
          while( (precision--)>0 ) *(zBuf++) = (char)vxGetdigit(&realvalue, &nsd);
          zBuf--;                            /* point to last digit */
          if( flag_rtz && flag_dp ){          /* Remove tail zeros */
            while( zBuf>=zWorker && *zBuf=='0' ) *(zBuf--) = 0;
            if( zBuf>=zWorker && *zBuf=='.' ) *(zBuf--) = 0;
          }
          zBuf++;                            /* point to next free slot */
          if( exp || flag_exp ){
            *(zBuf++) = pInfo->charset[0];
            if( exp<0 ){ *(zBuf++) = '-'; exp = -exp; } /* sign of exp */
            else       { *(zBuf++) = '+'; }
            if( exp>=100 ){
              *(zBuf++) = (char)((exp/100)+'0');                /* 100's digit */
              exp %= 100;
            }
            *(zBuf++) = (char)(exp/10+'0');                     /* 10's digit */
            *(zBuf++) = (char)(exp%10+'0');                     /* 1's digit */
          }
        }
        /* The converted number is in buf[] and zero terminated.Output it.
        ** Note that the number is in the usual order, not reversed as with
        ** integer conversions.*/
        length = (int)(zBuf-zWorker);
        zBuf = zWorker;
        /* Special case:  Add leading zeros if the flag_zeropad flag is
        ** set and we are not left justified */
        if( flag_zeropad && !flag_leftjustify && length < width){
          int i;
          int nPad = width - length;
          for(i=width; i>=nPad; i--){
            zBuf[i] = zBuf[i-nPad];
          }
          i = prefix!=0;
          while( nPad-- ) zBuf[i++] = '0';
          length = width;
        }
#else
         zBuf = " ";
		 length = (int)sizeof(char);
#endif /* JX9_OMIT_FLOATING_POINT */
		 break;
							 }
		default:
			/* Invalid format specifer */
			zWorker[0] = '?';
			length = (int)sizeof(char);
			break;
		}
		 /*
		 ** The text of the conversion is pointed to by "zBuf" and is
		 ** "length" characters long.The field width is "width".Do
		 ** the output.
		 */
    if( !flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
    if( length>0 ){
		rc = xConsumer(pCtx, zBuf, (unsigned int)length, pUserData);
		if( rc != SXRET_OK ){
		  return SXERR_ABORT; /* Consumer routine request an operation abort */
		}
    }
    if( flag_leftjustify ){
      register int nspace;
      nspace = width-length;
      if( nspace>0 ){
        while( nspace>=etSPACESIZE ){
			rc = xConsumer(pCtx, spaces, etSPACESIZE, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
			nspace -= etSPACESIZE;
        }
        if( nspace>0 ){
			rc = xConsumer(pCtx, spaces, (unsigned int)nspace, pUserData);
			if( rc != SXRET_OK ){
				return SXERR_ABORT; /* Consumer routine request an operation abort */
			}
		}
      }
    }
 }/* for(;;) */
	return SXRET_OK;
}